

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5hl.c
# Opt level: O0

char * MD5FileChunk(char *filename,char *buf,off_t ofs,off_t len)

{
  int __fd;
  int iVar1;
  __off_t _Var2;
  ssize_t sVar3;
  uchar *buf_00;
  int *piVar4;
  uchar *in_RCX;
  long in_RDX;
  char *in_RDI;
  off_t n;
  int e;
  int i;
  int f;
  stat stbuf;
  MD5_CTX ctx;
  uchar buffer [8192];
  uint in_stack_ffffffffffffded4;
  int iVar5;
  undefined4 in_stack_ffffffffffffdee0;
  undefined4 in_stack_ffffffffffffdee4;
  int iVar6;
  stat local_2110;
  MD5Context local_2080;
  undefined1 local_2028 [8192];
  uchar *local_28;
  long local_20;
  char *local_10;
  char *local_8;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_10 = in_RDI;
  MD5Init(&local_2080);
  __fd = open(local_10,0);
  if (__fd < 0) {
    local_8 = (char *)0x0;
  }
  else {
    iVar1 = fstat(__fd,&local_2110);
    if (iVar1 < 0) {
      local_8 = (char *)0x0;
    }
    else {
      if (local_2110.st_size < local_20) {
        local_20 = local_2110.st_size;
      }
      if ((local_28 == (uchar *)0x0) || (local_2110.st_size - local_20 < (long)local_28)) {
        local_28 = (uchar *)(local_2110.st_size - local_20);
      }
      _Var2 = lseek(__fd,local_20,0);
      if (_Var2 < 0) {
        local_8 = (char *)0x0;
      }
      else {
        iVar1 = 0;
        for (buf_00 = local_28; 0 < (long)buf_00; buf_00 = buf_00 + -(long)iVar1) {
          if (buf_00 < (uchar *)0x2001) {
            sVar3 = read(__fd,local_2028,(size_t)buf_00);
            iVar1 = (int)sVar3;
          }
          else {
            sVar3 = read(__fd,local_2028,0x2000);
            iVar1 = (int)sVar3;
          }
          if (iVar1 < 0) break;
          MD5Update((MD5Context *)CONCAT44(in_stack_ffffffffffffdee4,in_stack_ffffffffffffdee0),
                    buf_00,in_stack_ffffffffffffded4);
        }
        piVar4 = __errno_location();
        iVar5 = *piVar4;
        close(__fd);
        iVar6 = iVar5;
        piVar4 = __errno_location();
        *piVar4 = iVar5;
        if (iVar1 < 0) {
          local_8 = (char *)0x0;
        }
        else {
          local_8 = MD5End((MD5_CTX *)CONCAT44(__fd,iVar1),
                           (char *)CONCAT44(iVar6,in_stack_ffffffffffffdee0));
        }
      }
    }
  }
  return local_8;
}

Assistant:

char *MD5FileChunk(const char *filename, char *buf, off_t ofs, off_t len)
{
  unsigned char buffer[BUFSIZ];
  MD5_CTX ctx;
  struct stat stbuf;
  int f, i, e;
  off_t n;

  MD5Init(&ctx);
#ifdef _WIN32
  f = _open(filename, O_RDONLY | O_BINARY);
#else
  f = open(filename, O_RDONLY);
#endif
  if (f < 0)
    return 0;
  if (fstat(f, &stbuf) < 0)
    return 0;
  if (ofs > stbuf.st_size)
    ofs = stbuf.st_size;
  if ((len == 0) || (len > stbuf.st_size - ofs))
    len = stbuf.st_size - ofs;
  if (lseek(f, ofs, SEEK_SET) < 0)
    return 0;
  n = len;
  i = 0;
  while (n > 0) {
    if (n > sizeof(buffer))
      i = read(f, buffer, sizeof(buffer));
    else
      i = read(f, buffer, n);
    if (i < 0)
      break;
    MD5Update(&ctx, buffer, i);
    n -= i;
  }
  e = errno;
  close(f);
  errno = e;
  if (i < 0)
    return 0;
  return (MD5End(&ctx, buf));
}